

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void check_array_opt<zmq::sockopt::array_option<68,1>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               char param_3)

{
  __type _Var1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  undefined1 local_138 [8];
  undefined8 local_130;
  undefined1 local_128 [16];
  undefined8 local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  string s;
  string val;
  ScopedMessage scopedMessage13;
  ScopedMessage scopedMessage12;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,"foobar",(allocator<char> *)&catchAssertionHandler);
  local_138 = (undefined1  [8])0x18a9c9;
  local_130 = 0x61;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,macroName,(SourceLineInfo *)local_138,Info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &scopedMessage13,"setting ",param_2);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                  (string *)&scopedMessage13);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage12,(MessageBuilder *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&scopedMessage13);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  zmq::detail::socket_base::set<68,1>(param_1,&val);
  if (param_3 == '\0') {
    s._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
    s._M_string_length = 0x66;
    macroName_00.m_size = 4;
    macroName_00.m_start = "INFO";
    Catch::MessageBuilder::MessageBuilder
              ((MessageBuilder *)&catchAssertionHandler,macroName_00,(SourceLineInfo *)&s,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "getting ",param_2);
    std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                    (string *)local_138);
    Catch::ScopedMessage::ScopedMessage(&scopedMessage13,(MessageBuilder *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)local_138);
    Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
    zmq::detail::socket_base::get<68,1>(&s,param_1,0x400);
    local_138 = (undefined1  [8])0x18a9c9;
    local_130 = 0x68;
    macroName_01.m_size = 5;
    macroName_01.m_start = "CHECK";
    capturedExpression.m_size = 8;
    capturedExpression.m_start = "s == val";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_138,capturedExpression,
               ContinueOnFailure);
    _Var1 = std::operator==(&s,&val);
    local_130._0_2_ = CONCAT11(_Var1,true);
    local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001d7810;
    local_128._8_8_ = "==";
    local_118 = 2;
    local_128._0_8_ = &s;
    local_110 = &val;
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_138);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&s);
    Catch::ScopedMessage::~ScopedMessage(&scopedMessage13);
  }
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage12);
  std::__cxx11::string::~string((string *)&val);
  return;
}

Assistant:

void check_array_opt(T opt,
                     zmq::socket_t &sock,
                     std::string info,
                     bool set_only = false)
{
    const std::string val = "foobar";
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}